

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Function __thiscall
mp::BasicExprFactory<std::allocator<char>_>::CreateFunction
          (BasicExprFactory<std::allocator<char>_> *this,Impl **impl,StringRef name,int num_args,
          Type type)

{
  Impl *pIVar1;
  undefined8 *puVar2;
  ulong __n;
  size_t size;
  ulong uVar3;
  char *s;
  
  __n = name.size_;
  if (__n < 0xfffffffffffffff4) {
    uVar3 = 0xffffffffffffffff;
    if (__n < 0x1ffffffffffffff4) {
      uVar3 = __n * 8 + 0x60;
    }
    pIVar1 = (Impl *)operator_new__(uVar3);
    pIVar1->type = type;
    pIVar1->num_args = num_args;
    if (__n != 0) {
      memcpy(pIVar1->name,name.data_,__n);
    }
    pIVar1->name[__n] = '\0';
    *impl = pIVar1;
    return (Function)pIVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00291cd0;
  __cxa_throw(puVar2,&OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

expr::Kind kind() const { return kind_; }